

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O2

void __thiscall
miner_tests::MinerTestingSetup::TestPrioritisedMining
          (MinerTestingSetup *this,CScript *scriptPubKey,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txFirst)

{
  long lVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  readonly_property<bool> rVar6;
  CTxMemPool *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  ulong uVar7;
  iterator pvVar8;
  iterator pvVar9;
  assertion_result *paVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  char **ppcVar11;
  long local_470;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  assertion_result local_320;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  CMutableTransaction tx;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  Txid hashFreeGrandchild;
  Txid hashFreeChild;
  Txid hashFreeParent;
  Txid hashPrioritsedChild;
  Txid hashMediumFeeTx;
  Txid hashParentTx;
  undefined1 local_168 [24];
  char **ppcStack_150;
  uint256 hashFreePrioritisedTx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = MakeMempool(this);
  pvVar8 = (iterator)0x214;
  pvVar9 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock20,&this_00->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x214,false);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar3 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar4 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_168[0x10] = '\0';
  local_168[0x11] = '\0';
  local_168[0x12] = '\0';
  local_168[0x13] = '\0';
  local_168[0x14] = '\0';
  local_168[0x15] = '\0';
  local_168[0x16] = '\0';
  local_168[0x17] = '\0';
  ppcStack_150 = (char **)0x0;
  local_168._0_8_ = (char *)0x0;
  local_168._8_8_ = 0;
  other = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems._24_8_ = ppcStack_150;
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hashFreePrioritisedTx.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  entry.nFee = 0;
  entry.time.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  entry.spendsCoinbase = true;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_168._0_8_ = (char *)0x1dcd6500;
  CTxMemPool::PrioritiseTransaction(this_00,&hashFreePrioritisedTx,(CAmount *)local_168);
  peVar2 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar4 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x12a05ee18;
  CMutableTransaction::GetHash(&hashParentTx,&tx);
  entry.nFee = 1000;
  entry.time.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  entry.spendsCoinbase = true;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  peVar2 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar4 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x12a05caf0;
  CMutableTransaction::GetHash(&hashMediumFeeTx,&tx);
  entry.nFee = 10000;
  entry.time.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  entry.spendsCoinbase = true;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_168._0_8_ = (char *)0xffffffffe2329b00;
  CTxMemPool::PrioritiseTransaction(this_00,&hashMediumFeeTx.m_wrapped,(CAmount *)local_168);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       hashParentTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       hashParentTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       hashParentTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       hashParentTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x12a05ea30;
  CMutableTransaction::GetHash(&hashPrioritsedChild,&tx);
  entry.nFee = 1000;
  entry.time.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  entry.spendsCoinbase = false;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_168._0_8_ = (char *)0xbebc200;
  CTxMemPool::PrioritiseTransaction(this_00,&hashPrioritsedChild.m_wrapped,(CAmount *)local_168);
  peVar2 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar4 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash(&hashFreeParent,&tx);
  entry.nFee = 0;
  entry.spendsCoinbase = true;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_168._0_8_ = &DAT_3b9aca00;
  CTxMemPool::PrioritiseTransaction(this_00,&hashFreeParent.m_wrapped,(CAmount *)local_168);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       hashFreeParent.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       hashFreeParent.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       hashFreeParent.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       hashFreeParent.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash(&hashFreeChild,&tx);
  entry.nFee = 0;
  entry.spendsCoinbase = false;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_168._0_8_ = (char *)0x5f5e100;
  CTxMemPool::PrioritiseTransaction(this_00,&hashFreeChild.m_wrapped,(CAmount *)local_168);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       hashFreeChild.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       hashFreeChild.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       hashFreeChild.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       hashFreeChild.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash(&hashFreeGrandchild,&tx);
  entry.nFee = 0;
  entry.spendsCoinbase = false;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  AssemblerForTest((BlockAssembler *)local_168,this,this_00);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&pblocktemplate,(CScript *)local_168);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x251;
  file.m_begin = (iterator)&local_2c8;
  msg.m_end = pvVar9;
  msg.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2d8,msg);
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  ppcStack_150 = (char **)0xc7f1cc;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_2e0 = "";
  local_320._0_8_ =
       *(long *)((long)pblocktemplate._M_t.
                       super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                       .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x58) -
       *(long *)((long)pblocktemplate._M_t.
                       super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                       .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x50) >>
       4;
  paVar10 = &local_320;
  local_330 = (char *)CONCAT44(local_330._4_4_,6);
  pvVar8 = (iterator)0x2;
  ppcVar11 = &local_330;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_2e8,0x251);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x252;
  file_00.m_begin = (iterator)&local_2f8;
  msg_00.m_end = (iterator)paVar10;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_308,
             msg_00);
  rVar6.super_class_property<bool>.value =
       (class_property<bool>)
       transaction_identifier<false>::operator==
                 ((transaction_identifier<false> *)
                  (*(long *)(*(long *)((long)pblocktemplate._M_t.
                                             super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>.
                                             _M_head_impl + 0x50) + 0x10) + 0x39),&hashFreeParent);
  local_320.m_message.px = (element_type *)0x0;
  local_320.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330 = "pblocktemplate->block.vtx[1]->GetHash() == hashFreeParent";
  local_328 = "";
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_338 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  ppcStack_150 = &local_330;
  local_320.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar6.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_320,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar11,(size_t)&local_340,
             0x252);
  boost::detail::shared_count::~shared_count(&local_320.m_message.pn);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x253;
  file_01.m_begin = (iterator)&local_350;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_360,
             msg_01);
  local_320.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       transaction_identifier<false>::operator==
                 ((transaction_identifier<false> *)
                  (*(long *)(*(long *)((long)pblocktemplate._M_t.
                                             super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>.
                                             _M_head_impl + 0x50) + 0x20) + 0x39),
                  &hashFreePrioritisedTx);
  local_320.m_message.px = (element_type *)0x0;
  local_320.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330 = "pblocktemplate->block.vtx[2]->GetHash() == hashFreePrioritisedTx";
  local_328 = "";
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_368 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  ppcStack_150 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (&local_320,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar11,(size_t)&local_370,
             0x253);
  boost::detail::shared_count::~shared_count(&local_320.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x254;
  file_02.m_begin = (iterator)&local_380;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_390,
             msg_02);
  local_320.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       transaction_identifier<false>::operator==
                 ((transaction_identifier<false> *)
                  (*(long *)(*(long *)((long)pblocktemplate._M_t.
                                             super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>.
                                             _M_head_impl + 0x50) + 0x30) + 0x39),&hashParentTx);
  local_320.m_message.px = (element_type *)0x0;
  local_320.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330 = "pblocktemplate->block.vtx[3]->GetHash() == hashParentTx";
  local_328 = "";
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_398 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  ppcStack_150 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (&local_320,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar11,(size_t)&local_3a0,
             0x254);
  boost::detail::shared_count::~shared_count(&local_320.m_message.pn);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x255;
  file_03.m_begin = (iterator)&local_3b0;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c0,
             msg_03);
  local_320.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       transaction_identifier<false>::operator==
                 ((transaction_identifier<false> *)
                  (*(long *)(*(long *)((long)pblocktemplate._M_t.
                                             super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>.
                                             _M_head_impl + 0x50) + 0x40) + 0x39),
                  &hashPrioritsedChild);
  local_320.m_message.px = (element_type *)0x0;
  local_320.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330 = "pblocktemplate->block.vtx[4]->GetHash() == hashPrioritsedChild";
  local_328 = "";
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3c8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  ppcStack_150 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (&local_320,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar11,(size_t)&local_3d0,
             0x255);
  boost::detail::shared_count::~shared_count(&local_320.m_message.pn);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x256;
  file_04.m_begin = (iterator)&local_3e0;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3f0,
             msg_04);
  local_320.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       transaction_identifier<false>::operator==
                 ((transaction_identifier<false> *)
                  (*(long *)(*(long *)((long)pblocktemplate._M_t.
                                             super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>.
                                             _M_head_impl + 0x50) + 0x50) + 0x39),&hashFreeChild);
  local_320.m_message.px = (element_type *)0x0;
  local_320.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_330 = "pblocktemplate->block.vtx[5]->GetHash() == hashFreeChild";
  local_328 = "";
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3f8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  ppcStack_150 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (&local_320,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar11,(size_t)&local_400,
             0x256);
  boost::detail::shared_count::~shared_count(&local_320.m_message.pn);
  local_470 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)(*(long *)((long)pblocktemplate._M_t.
                                      super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                      .super__Head_base<0UL,_node::CBlockTemplate_*,_false>.
                                      _M_head_impl + 0x58) -
                      *(long *)((long)pblocktemplate._M_t.
                                      super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                      .super__Head_base<0UL,_node::CBlockTemplate_*,_false>.
                                      _M_head_impl + 0x50) >> 4); uVar7 = uVar7 + 1) {
    local_410 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
    local_408 = "";
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    local_418 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x259;
    file_05.m_begin = (iterator)&local_410;
    msg_05.m_end = pvVar9;
    msg_05.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_420,
               msg_05);
    rVar6.super_class_property<bool>.value =
         (class_property<bool>)
         transaction_identifier<false>::operator!=
                   ((transaction_identifier<false> *)
                    (*(long *)(*(long *)((long)pblocktemplate._M_t.
                                               super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                               .super__Head_base<0UL,_node::CBlockTemplate_*,_false>
                                               ._M_head_impl + 0x50) + local_470) + 0x39),
                    &hashFreeGrandchild);
    local_320.m_message.px = (element_type *)0x0;
    local_320.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_330 = "pblocktemplate->block.vtx[i]->GetHash() != hashFreeGrandchild";
    local_328 = "";
    local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
    local_168._0_8_ = &PTR__lazy_ostream_011481f0;
    local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_430 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
    local_428 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    ppcStack_150 = &local_330;
    local_320.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar6.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_320,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar11,(size_t)&local_430
               ,0x259);
    boost::detail::shared_count::~shared_count(&local_320.m_message.pn);
    local_440 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x25b;
    file_06.m_begin = (iterator)&local_440;
    msg_06.m_end = pvVar9;
    msg_06.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_450,
               msg_06);
    local_320.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         transaction_identifier<false>::operator!=
                   ((transaction_identifier<false> *)
                    (*(long *)(*(long *)((long)pblocktemplate._M_t.
                                               super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                               .super__Head_base<0UL,_node::CBlockTemplate_*,_false>
                                               ._M_head_impl + 0x50) + local_470) + 0x39),
                    &hashMediumFeeTx);
    local_320.m_message.px = (element_type *)0x0;
    local_320.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_330 = "pblocktemplate->block.vtx[i]->GetHash() != hashMediumFeeTx";
    local_328 = "";
    local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
    local_168._0_8_ = &PTR__lazy_ostream_011481f0;
    local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_460 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
    local_458 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    ppcStack_150 = &local_330;
    boost::test_tools::tt_detail::report_assertion
              (&local_320,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar11,(size_t)&local_460
               ,0x25b);
    boost::detail::shared_count::~shared_count(&local_320.m_message.pn);
    local_470 = local_470 + 0x10;
  }
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&pblocktemplate);
  CMutableTransaction::~CMutableTransaction(&tx);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock20.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MinerTestingSetup::TestPrioritisedMining(const CScript& scriptPubKey, const std::vector<CTransactionRef>& txFirst)
{
    CTxMemPool& tx_mempool{MakeMempool()};
    LOCK(tx_mempool.cs);

    TestMemPoolEntryHelper entry;

    // Test that a tx below min fee but prioritised is included
    CMutableTransaction tx;
    tx.vin.resize(1);
    tx.vin[0].prevout.hash = txFirst[0]->GetHash();
    tx.vin[0].prevout.n = 0;
    tx.vin[0].scriptSig = CScript() << OP_1;
    tx.vout.resize(1);
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    uint256 hashFreePrioritisedTx = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashFreePrioritisedTx, 5 * COIN);

    tx.vin[0].prevout.hash = txFirst[1]->GetHash();
    tx.vin[0].prevout.n = 0;
    tx.vout[0].nValue = 5000000000LL - 1000;
    // This tx has a low fee: 1000 satoshis
    Txid hashParentTx = tx.GetHash(); // save this txid for later use
    tx_mempool.addUnchecked(entry.Fee(1000).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));

    // This tx has a medium fee: 10000 satoshis
    tx.vin[0].prevout.hash = txFirst[2]->GetHash();
    tx.vout[0].nValue = 5000000000LL - 10000;
    Txid hashMediumFeeTx = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(10000).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashMediumFeeTx, -5 * COIN);

    // This tx also has a low fee, but is prioritised
    tx.vin[0].prevout.hash = hashParentTx;
    tx.vout[0].nValue = 5000000000LL - 1000 - 1000; // 1000 satoshi fee
    Txid hashPrioritsedChild = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(1000).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashPrioritsedChild, 2 * COIN);

    // Test that transaction selection properly updates ancestor fee calculations as prioritised
    // parents get included in a block. Create a transaction with two prioritised ancestors, each
    // included by itself: FreeParent <- FreeChild <- FreeGrandchild.
    // When FreeParent is added, a modified entry will be created for FreeChild + FreeGrandchild
    // FreeParent's prioritisation should not be included in that entry.
    // When FreeChild is included, FreeChild's prioritisation should also not be included.
    tx.vin[0].prevout.hash = txFirst[3]->GetHash();
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    Txid hashFreeParent = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).SpendsCoinbase(true).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashFreeParent, 10 * COIN);

    tx.vin[0].prevout.hash = hashFreeParent;
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    Txid hashFreeChild = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).SpendsCoinbase(false).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashFreeChild, 1 * COIN);

    tx.vin[0].prevout.hash = hashFreeChild;
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    Txid hashFreeGrandchild = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).SpendsCoinbase(false).FromTx(tx));

    auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
    BOOST_REQUIRE_EQUAL(pblocktemplate->block.vtx.size(), 6U);
    BOOST_CHECK(pblocktemplate->block.vtx[1]->GetHash() == hashFreeParent);
    BOOST_CHECK(pblocktemplate->block.vtx[2]->GetHash() == hashFreePrioritisedTx);
    BOOST_CHECK(pblocktemplate->block.vtx[3]->GetHash() == hashParentTx);
    BOOST_CHECK(pblocktemplate->block.vtx[4]->GetHash() == hashPrioritsedChild);
    BOOST_CHECK(pblocktemplate->block.vtx[5]->GetHash() == hashFreeChild);
    for (size_t i=0; i<pblocktemplate->block.vtx.size(); ++i) {
        // The FreeParent and FreeChild's prioritisations should not impact the child.
        BOOST_CHECK(pblocktemplate->block.vtx[i]->GetHash() != hashFreeGrandchild);
        // De-prioritised transaction should not be included.
        BOOST_CHECK(pblocktemplate->block.vtx[i]->GetHash() != hashMediumFeeTx);
    }
}